

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VGetArrayPointer(N_Vector W,sunindextype param_2,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  realtype *Wdata;
  double maxt;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  sunindextype local_length_local;
  N_Vector W_local;
  
  dVar2 = get_time();
  N_VGetArrayPointer(W);
  dVar3 = get_time();
  iVar1 = has_data(W);
  if (iVar1 == 0) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
    printf("    Vector data == NULL \n\n");
    W_local._4_4_ = 1;
  }
  else {
    N_VConst(-0.5,W);
    iVar1 = check_ans(-0.5,W,param_2);
    if (iVar1 == 0) {
      if (myid == 0) {
        printf("PASSED test -- N_VGetArrayPointer \n");
      }
      dVar2 = max_time(W,dVar3 - dVar2);
      if (print_time != 0) {
        printf("%s Time: %22.15e\n\n",dVar2,"N_VGetArrayPointer");
      }
      W_local._4_4_ = 0;
    }
    else {
      printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
      printf("    Failed N_VConst check \n\n");
      W_local._4_4_ = 1;
    }
  }
  return W_local._4_4_;
}

Assistant:

int Test_N_VGetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int      failure = 0;
  double   start_time, stop_time, maxt;
  realtype *Wdata;

  /* get vector data, time it and set it to NULL */
  start_time = get_time();
  Wdata = N_VGetArrayPointer(W);
  stop_time = get_time();
  Wdata++; Wdata=NULL; /* Do something with pointer to surpress warning */

  /* check vector data */
  if (!has_data(W)) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    return(1);
  }

  N_VConst(NEG_HALF,W);
  failure = check_ans(NEG_HALF, W, local_length);

  if (failure) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    return(1);
  }

  if (myid == 0)
    printf("PASSED test -- N_VGetArrayPointer \n");

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VGetArrayPointer", maxt);

  return(0);
}